

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMDataProviders.cpp
# Opt level: O1

AtmosSyncDataProvider * __thiscall
ASDCP::AtmosSyncDataProvider::PutSample
          (AtmosSyncDataProvider *this,ui32_t numChannels,byte_t *buf,ui32_t *bytesWritten)

{
  void *__src;
  ILogSink *this_00;
  undefined4 in_register_00000034;
  long lVar1;
  undefined1 *puVar2;
  undefined4 *in_R8;
  
  lVar1 = CONCAT44(in_register_00000034,numChannels);
  puVar2 = Kumu::RESULT_PTR;
  if ((bytesWritten != (ui32_t *)0x0) && (__src = *(void **)(lVar1 + 0x110), __src != (void *)0x0))
  {
    if (*(uint *)(lVar1 + 0xf4) < (uint)buf) {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error
                (this_00,"Requested %u channels from a wav file with %u channel.",
                 (ulong)buf & 0xffffffff,(ulong)*(uint *)(lVar1 + 0xf4));
      puVar2 = Kumu::RESULT_FAIL;
    }
    else {
      *in_R8 = *(undefined4 *)(lVar1 + 0x118);
      memcpy(bytesWritten,__src,(ulong)*(uint *)(lVar1 + 0x118));
      *(long *)(lVar1 + 0x110) = *(long *)(lVar1 + 0x110) + (ulong)*(uint *)(lVar1 + 0x118);
      puVar2 = Kumu::RESULT_OK;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar2);
  return this;
}

Assistant:

Result_t
ASDCP::AtmosSyncDataProvider::PutSample(const ui32_t numChannels, byte_t* buf, ui32_t* bytesWritten)
{
  ASDCP_TEST_NULL(buf);
  ASDCP_TEST_NULL(m_ptr);
  if ( numChannels > m_ADesc.ChannelCount)
  {
    DefaultLogSink().Error("Requested %u channels from a wav file with %u channel.", numChannels,
                           m_ADesc.ChannelCount);
    return RESULT_FAIL;
  }

  (*bytesWritten) = m_SampleSize;
  ::memcpy(buf, m_ptr, m_SampleSize);
  m_ptr += m_SampleSize;
  return RESULT_OK;
}